

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigCheckOutputSimsSavePattern(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Ivy_FraigSim_t *pIVar3;
  void *pvVar4;
  Ivy_Obj_t *pObj_00;
  int *pModel;
  int local_28;
  int BestPat;
  int k;
  int i;
  Ivy_FraigSim_t *pSims;
  Ivy_Obj_t *pObj_local;
  Ivy_FraigMan_t *p_local;
  
  pIVar3 = Ivy_ObjSim(pObj);
  for (BestPat = 0; (BestPat < p->nSimWords && ((&pIVar3[1].Type)[BestPat] == 0));
      BestPat = BestPat + 1) {
  }
  if (p->nSimWords <= BestPat) {
    __assert_fail("i < p->nSimWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0x524,"void Ivy_FraigCheckOutputSimsSavePattern(Ivy_FraigMan_t *, Ivy_Obj_t *)");
  }
  local_28 = 0;
  while ((local_28 < 0x20 && (((&pIVar3[1].Type)[BestPat] & 1 << ((byte)local_28 & 0x1f)) == 0))) {
    local_28 = local_28 + 1;
  }
  if (local_28 < 0x20) {
    iVar1 = BestPat * 0x20;
    iVar2 = Ivy_ManPiNum(p->pManFraig);
    pvVar4 = malloc((long)iVar2 << 2);
    for (BestPat = 0; iVar2 = Vec_PtrSize(p->pManAig->vPis), BestPat < iVar2; BestPat = BestPat + 1)
    {
      pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(p->pManAig->vPis,BestPat);
      pIVar3 = Ivy_ObjSim(pObj_00);
      iVar2 = Ivy_InfoHasBit((uint *)(pIVar3 + 1),iVar1 + local_28);
      *(int *)((long)pvVar4 + (long)BestPat * 4) = iVar2;
    }
    if (p->pManFraig->pData == (void *)0x0) {
      p->pManFraig->pData = pvVar4;
      return;
    }
    __assert_fail("p->pManFraig->pData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0x535,"void Ivy_FraigCheckOutputSimsSavePattern(Ivy_FraigMan_t *, Ivy_Obj_t *)");
  }
  __assert_fail("k < 32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                ,0x529,"void Ivy_FraigCheckOutputSimsSavePattern(Ivy_FraigMan_t *, Ivy_Obj_t *)");
}

Assistant:

void Ivy_FraigCheckOutputSimsSavePattern( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj )
{ 
    Ivy_FraigSim_t * pSims;
    int i, k, BestPat, * pModel;
    // find the word of the pattern
    pSims = Ivy_ObjSim(pObj);
    for ( i = 0; i < p->nSimWords; i++ )
        if ( pSims->pData[i] )
            break;
    assert( i < p->nSimWords );
    // find the bit of the pattern
    for ( k = 0; k < 32; k++ )
        if ( pSims->pData[i] & (1 << k) )
            break;
    assert( k < 32 );
    // determine the best pattern
    BestPat = i * 32 + k;
    // fill in the counter-example data
    pModel = ABC_ALLOC( int, Ivy_ManPiNum(p->pManFraig) );
    Ivy_ManForEachPi( p->pManAig, pObj, i )
    {
        pModel[i] = Ivy_InfoHasBit(Ivy_ObjSim(pObj)->pData, BestPat);
//        printf( "%d", pModel[i] );
    }
//    printf( "\n" );
    // set the model
    assert( p->pManFraig->pData == NULL );
    p->pManFraig->pData = pModel;
    return;
}